

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdsample.c
# Opt level: O1

void h2v1_fancy_upsample(j_decompress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
                        JSAMPARRAY *output_data_ptr)

{
  byte bVar1;
  JSAMPARRAY ppJVar2;
  byte *pbVar3;
  byte *pbVar4;
  byte *pbVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  
  if (0 < cinfo->max_v_samp_factor) {
    ppJVar2 = *output_data_ptr;
    lVar6 = 0;
    do {
      pbVar3 = input_data[lVar6];
      pbVar4 = ppJVar2[lVar6];
      bVar1 = *pbVar3;
      *pbVar4 = bVar1;
      pbVar4[1] = (byte)((uint)pbVar3[1] + (uint)bVar1 + (uint)bVar1 * 2 + 2 >> 2);
      iVar8 = compptr->downsampled_width - 2;
      while( true ) {
        pbVar5 = pbVar4 + 2;
        pbVar3 = pbVar3 + 1;
        if (iVar8 == 0) break;
        iVar7 = (uint)*pbVar3 + (uint)*pbVar3 * 2;
        *pbVar5 = (byte)((uint)pbVar3[-1] + iVar7 + 1 >> 2);
        pbVar5[1] = (byte)(iVar7 + (uint)pbVar3[1] + 2 >> 2);
        iVar8 = iVar8 + -1;
        pbVar4 = pbVar5;
      }
      bVar1 = *pbVar3;
      *pbVar5 = (byte)((uint)pbVar3[-1] + (uint)bVar1 + (uint)bVar1 * 2 + 1 >> 2);
      pbVar4[3] = bVar1;
      lVar6 = lVar6 + 1;
    } while (lVar6 < cinfo->max_v_samp_factor);
  }
  return;
}

Assistant:

METHODDEF(void)
h2v1_fancy_upsample(j_decompress_ptr cinfo, jpeg_component_info *compptr,
                    JSAMPARRAY input_data, JSAMPARRAY *output_data_ptr)
{
  JSAMPARRAY output_data = *output_data_ptr;
  register JSAMPROW inptr, outptr;
  register int invalue;
  register JDIMENSION colctr;
  int inrow;

  for (inrow = 0; inrow < cinfo->max_v_samp_factor; inrow++) {
    inptr = input_data[inrow];
    outptr = output_data[inrow];
    /* Special case for first column */
    invalue = *inptr++;
    *outptr++ = (JSAMPLE)invalue;
    *outptr++ = (JSAMPLE)((invalue * 3 + inptr[0] + 2) >> 2);

    for (colctr = compptr->downsampled_width - 2; colctr > 0; colctr--) {
      /* General case: 3/4 * nearer pixel + 1/4 * further pixel */
      invalue = (*inptr++) * 3;
      *outptr++ = (JSAMPLE)((invalue + inptr[-2] + 1) >> 2);
      *outptr++ = (JSAMPLE)((invalue + inptr[0] + 2) >> 2);
    }

    /* Special case for last column */
    invalue = *inptr;
    *outptr++ = (JSAMPLE)((invalue * 3 + inptr[-1] + 1) >> 2);
    *outptr++ = (JSAMPLE)invalue;
  }
}